

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

void chaiscript::detail::Dispatch_Engine::
     add_keyed_value<std::vector<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>>,std::__cxx11::string,chaiscript::Boxed_Value>
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
                *t_c,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_key,
               Boxed_Value *t_value)

{
  iterator this;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  local_50;
  
  this = find_keyed_value<std::vector<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>>,std::__cxx11::string>
                   (t_c,t_key);
  if (this._M_current !=
      (t_c->
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
    ::pair<chaiscript::Boxed_Value,_true>(&local_50,t_key,t_value);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
    ::operator=(this._M_current,&local_50);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
    ::~pair(&local_50);
    return;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::reserve(t_c,((long)this._M_current -
                (long)(t_c->
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x30 + 1);
  std::
  vector<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>>
  ::emplace_back<std::__cxx11::string_const&,chaiscript::Boxed_Value>
            ((vector<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>>
              *)t_c,t_key,t_value);
  return;
}

Assistant:

static void add_keyed_value(Container &t_c, const Key &t_key, Value &&t_value)
          {
            auto itr = find_keyed_value(t_c, t_key);

            if (itr == t_c.end()) {
              t_c.reserve(t_c.size() + 1); // tightly control growth of memory usage here
              t_c.emplace_back(t_key, std::forward<Value>(t_value));
            } else {
              typedef typename Container::value_type value_type;
              *itr = value_type(t_key, std::forward<Value>(t_value));
            }
          }